

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O1

string * __thiscall
duckdb::CastExceptionText<duckdb::timestamp_t,duckdb::timestamp_ms_t>
          (string *__return_storage_ptr__,duckdb *this,timestamp_t input)

{
  undefined8 *puVar1;
  size_type *psVar2;
  undefined8 uVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 *local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)local_40);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x77b0fe);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_50 = *plVar6;
    lStack_48 = plVar4[3];
    local_60 = &local_50;
  }
  else {
    local_50 = *plVar6;
    local_60 = (long *)*plVar4;
  }
  local_58 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_60);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_d0 = *puVar7;
    lStack_c8 = plVar4[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar7;
    local_e0 = (ulong *)*plVar4;
  }
  local_d8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  duckdb::ConvertToString::Operation<duckdb::timestamp_t>((timestamp_t)&local_80);
  uVar8 = 0xf;
  if (local_e0 != &local_d0) {
    uVar8 = local_d0;
  }
  if (uVar8 < (ulong)(local_78 + local_d8)) {
    uVar8 = 0xf;
    if (local_80 != local_70) {
      uVar8 = local_70[0];
    }
    if (uVar8 < (ulong)(local_78 + local_d8)) goto LAB_005ca6bc;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_e0);
  }
  else {
LAB_005ca6bc:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_80);
  }
  local_100 = &local_f0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_f0 = *puVar1;
    uStack_e8 = puVar5[3];
  }
  else {
    local_f0 = *puVar1;
    local_100 = (undefined8 *)*puVar5;
  }
  local_f8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_100);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_b0 = *puVar7;
    lStack_a8 = plVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar7;
    local_c0 = (ulong *)*plVar4;
  }
  local_b8 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  duckdb::TypeIdToString_abi_cxx11_((char)&local_98 - UINT64);
  uVar8 = 0xf;
  if (local_c0 != &local_b0) {
    uVar8 = local_b0;
  }
  if (uVar8 < (ulong)(local_98 + local_b8)) {
    uVar8 = 0xf;
    if (local_a0 != local_90) {
      uVar8 = local_90[0];
    }
    if ((ulong)(local_98 + local_b8) <= uVar8) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_a0,0,(char *)0x0,(ulong)local_c0);
      goto LAB_005ca7ee;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_a0);
LAB_005ca7ee:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar2 = puVar5 + 2;
  if ((size_type *)*puVar5 == psVar2) {
    uVar3 = puVar5[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar5;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar2;
  }
  __return_storage_ptr__->_M_string_length = puVar5[1];
  *puVar5 = psVar2;
  puVar5[1] = 0;
  *(undefined1 *)psVar2 = 0;
  if (local_a0 != local_90) {
    operator_delete(local_a0);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0);
  }
  if (local_100 != &local_f0) {
    operator_delete(local_100);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0);
  }
  if (local_60 != &local_50) {
    operator_delete(local_60);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static string CastExceptionText(SRC input) {
	if (std::is_same<SRC, string_t>()) {
		return "Could not convert string '" + ConvertToString::Operation<SRC>(input) + "' to " +
		       TypeIdToString(GetTypeId<DST>());
	}
	if (TypeIsNumber<SRC>() && TypeIsNumber<DST>()) {
		return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
		       " can't be cast because the value is out of range for the destination type " +
		       TypeIdToString(GetTypeId<DST>());
	}
	return "Type " + TypeIdToString(GetTypeId<SRC>()) + " with value " + ConvertToString::Operation<SRC>(input) +
	       " can't be cast to the destination type " + TypeIdToString(GetTypeId<DST>());
}